

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReaderCache::purge(PtexReaderCache *this,PtexCachedReader *reader)

{
  size_t *psVar1;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  size_t memUsedChange;
  size_t local_10;
  
  bVar3 = PtexCachedReader::tryPurge(reader,&local_10);
  if ((bVar3) && (local_10 != 0)) {
    LOCK();
    psVar1 = &this->_memUsed;
    sVar2 = *psVar1;
    *psVar1 = *psVar1 + local_10;
    UNLOCK();
    uVar4 = sVar2 + local_10;
    if (sVar2 + local_10 < this->_peakMemUsed) {
      uVar4 = this->_peakMemUsed;
    }
    this->_peakMemUsed = uVar4;
  }
  return;
}

Assistant:

void PtexReaderCache::purge(PtexCachedReader* reader)
{
    size_t memUsedChange;
    if (reader->tryPurge(memUsedChange)) {
        adjustMemUsed(memUsedChange);
    }
}